

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

char * __thiscall
Memory::HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
TryAllocFromNewHeapBlock
          (HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
           *this,Recycler *recycler,TBlockAllocatorType *allocator,size_t sizeCat,size_t size,
          ObjectInfoBits attributes)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *heapBlock_00;
  char *memBlock;
  SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *heapBlock;
  AutoFilterExceptionRegion local_40;
  ObjectInfoBits local_3a;
  AutoFilterExceptionRegion __autoFilterExceptionRegion;
  ObjectInfoBits attributes_local;
  size_t size_local;
  size_t sizeCat_local;
  TBlockAllocatorType *allocator_local;
  Recycler *recycler_local;
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  *this_local;
  
  local_3a = attributes;
  ___autoFilterExceptionRegion = size;
  AutoFilterExceptionRegion::AutoFilterExceptionRegion(&local_40,ExceptionType_All);
  if ((local_3a & InternalObjectInfoBitMask) != local_3a) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x242,"((attributes & InternalObjectInfoBitMask) == attributes)",
                       "(attributes & InternalObjectInfoBitMask) == attributes");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = HeapBucket::IsPageHeapEnabled(&this->super_HeapBucket,local_3a);
  if (bVar2) {
    this_local = (HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                  *)PageHeapAlloc(this,recycler,sizeCat,___autoFilterExceptionRegion,local_3a,
                                  ((this->super_HeapBucket).heapInfo)->pageHeapMode,true);
  }
  else {
    heapBlock_00 = CreateHeapBlock(this,recycler);
    if (heapBlock_00 == (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      this_local = (HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                    *)0x0;
    }
    else {
      SmallHeapBlockAllocator<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
      ::SetNew(allocator,heapBlock_00);
      this_local = (HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                    *)SmallHeapBlockAllocator<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                      ::SlowAlloc<false>(allocator,recycler,sizeCat,local_3a);
      if (this_local ==
          (HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_> *
          )0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                           ,0x255,"(memBlock != nullptr || false)",
                           "memBlock != nullptr || IS_FAULTINJECT_NO_THROW_ON");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
    }
  }
  AutoFilterExceptionRegion::~AutoFilterExceptionRegion(&local_40);
  return (char *)this_local;
}

Assistant:

char *
HeapBucketT<TBlockType>::TryAllocFromNewHeapBlock(Recycler * recycler, TBlockAllocatorType * allocator, size_t sizeCat, size_t size, ObjectInfoBits attributes)
{
    AUTO_NO_EXCEPTION_REGION;

    Assert((attributes & InternalObjectInfoBitMask) == attributes);

#ifdef RECYCLER_PAGE_HEAP
    if (IsPageHeapEnabled(attributes))
    {
        return this->PageHeapAlloc(recycler, sizeCat, size, attributes, this->heapInfo->pageHeapMode, true);
    }
#endif

    TBlockType * heapBlock = CreateHeapBlock(recycler);
    if (heapBlock == nullptr)
    {
        return nullptr;
    }

    // new heap block added, allocate from that.
    allocator->SetNew(heapBlock);
    // We just created a block we can allocate on
    char * memBlock = allocator->template SlowAlloc<false /* disallow fault injection */>(recycler, sizeCat, attributes);
    Assert(memBlock != nullptr || IS_FAULTINJECT_NO_THROW_ON);
    return memBlock;
}